

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXF.cpp
# Opt level: O0

PacketList * __thiscall
ASDCP::MXF::Partition::PacketList::GetMDObjectsByType
          (PacketList *this,byte_t *ObjectID,
          list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
          *ObjectList)

{
  iterator this_00;
  bool bVar1;
  uint uVar2;
  reference ppIVar3;
  _List_node_base *in_RCX;
  Result_t *local_70;
  _Self local_40;
  _List_node_base *local_38;
  _List_iterator<ASDCP::MXF::InterchangeObject_*> local_30;
  iterator li;
  list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
  *ObjectList_local;
  byte_t *ObjectID_local;
  PacketList *this_local;
  
  if (ObjectList ==
      (list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_> *)0x0
     ) {
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)Kumu::RESULT_PTR);
  }
  else {
    li._M_node = in_RCX;
    std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::_List_iterator(&local_30);
    local_38 = (_List_node_base *)
               std::__cxx11::
               list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
               ::begin((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                        *)ObjectID);
    local_30._M_node = local_38;
    while( true ) {
      local_40._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
           end((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                *)ObjectID);
      bVar1 = std::operator!=(&local_30,&local_40);
      if (!bVar1) break;
      ppIVar3 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_30);
      uVar2 = (*((*ppIVar3)->super_KLVPacket)._vptr_KLVPacket[4])();
      this_00 = li;
      if ((uVar2 & 1) != 0) {
        ppIVar3 = std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator*(&local_30);
        std::__cxx11::
        list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>::
        push_back((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                   *)this_00._M_node,ppIVar3);
      }
      std::_List_iterator<ASDCP::MXF::InterchangeObject_*>::operator++(&local_30,0);
    }
    bVar1 = std::__cxx11::
            list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
            ::empty((list<ASDCP::MXF::InterchangeObject_*,_std::allocator<ASDCP::MXF::InterchangeObject_*>_>
                     *)li._M_node);
    if (bVar1) {
      local_70 = (Result_t *)Kumu::RESULT_FAIL;
    }
    else {
      local_70 = (Result_t *)Kumu::RESULT_OK;
    }
    Kumu::Result_t::Result_t((Result_t *)this,local_70);
  }
  return this;
}

Assistant:

ASDCP::Result_t
ASDCP::MXF::Partition::PacketList::GetMDObjectsByType(const byte_t* ObjectID, std::list<InterchangeObject*>& ObjectList)
{
  ASDCP_TEST_NULL(ObjectID);
  std::list<InterchangeObject*>::iterator li;

  for ( li = m_List.begin(); li != m_List.end(); li++ )
    {
      if ( (*li)->HasUL(ObjectID) )
	ObjectList.push_back(*li);
    }

  return ObjectList.empty() ? RESULT_FAIL : RESULT_OK;
}